

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mac.c
# Opt level: O0

void InitMacCtx(arguments *args,MacCtx_t *context,uint64_t *mac_key)

{
  SkeinSize_t SVar1;
  uint8_t uVar2;
  uint16_t key_byte_size;
  uint64_t *mac_key_local;
  MacCtx_t *context_local;
  arguments *args_local;
  
  SVar1 = args->state_size;
  context->skein_context_ptr = &context->skein_context;
  uVar2 = '\a';
  if ((args->field_0x3c & 1) != 0) {
    uVar2 = '\x03';
  }
  context->out_action = uVar2;
  context->mac_key = mac_key;
  context->digest_byte_size = (ulong)(args->state_size >> 3);
  skeinCtxPrepare(context->skein_context_ptr,args->state_size);
  skeinMacInit(context->skein_context_ptr,(uint8_t *)mac_key,(ulong)(SVar1 & 0xffff) / 8,
               (ulong)args->state_size);
  return;
}

Assistant:

void InitMacCtx(const arguments* args,
                MacCtx_t* context,
                uint64_t* mac_key)
{
    const uint16_t key_byte_size = (const uint16_t)args->state_size/8;

    context->skein_context_ptr = &(context->skein_context);
    context->out_action = args->encrypt ? DECRYPT : WRITE;
    context->mac_key = mac_key;
    context->digest_byte_size = (uint64_t)args->state_size/8;

    skeinCtxPrepare(context->skein_context_ptr, args->state_size);
    skeinMacInit(context->skein_context_ptr, 
                 (uint8_t*)mac_key, 
                 key_byte_size, 
                 args->state_size); //digest size is in bits in Skein Mac Init
}